

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMain.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined4 in_EAX;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  UnitTest *this;
  raw_ostream *in_R9;
  StringRef Argv0;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT44(argc,in_EAX);
  pcVar2 = getenv("LLVM_PROGRAM_TEST_NO_STACKTRACE_HANDLER");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(pcVar2);
    }
    Argv0.Length = sVar3;
    Argv0.Data = pcVar2;
    llvm::sys::PrintStackTraceOnErrorSignal(Argv0,true);
  }
  testing::InitGoogleMock((int *)((long)&uStack_18 + 4),argv);
  llvm::cl::ParseCommandLineOptions
            ((cl *)(uStack_18 >> 0x20),(int)argv,(char **)0x2036db,(StringRef)ZEXT816(0),in_R9);
  TestMainArgv0 = *argv;
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  // Skip setting up signal handlers for tests that need to test things without
  // them configured.
  if (!getenv("LLVM_PROGRAM_TEST_NO_STACKTRACE_HANDLER")) {
    llvm::sys::PrintStackTraceOnErrorSignal(argv[0],
                                            true /* Disable crash reporting */);
  }

  // Initialize both gmock and gtest.
  testing::InitGoogleMock(&argc, argv);

  llvm::cl::ParseCommandLineOptions(argc, argv);

  // Make it easy for a test to re-execute itself by saving argv[0].
  TestMainArgv0 = argv[0];

# if defined(_WIN32)
  // Disable all of the possible ways Windows conspires to make automated
  // testing impossible.
  ::SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#   if defined(_MSC_VER)
    ::_set_error_mode(_OUT_TO_STDERR);
    _CrtSetReportMode(_CRT_WARN, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
    _CrtSetReportFile(_CRT_WARN, _CRTDBG_FILE_STDERR);
    _CrtSetReportMode(_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
    _CrtSetReportFile(_CRT_ERROR, _CRTDBG_FILE_STDERR);
    _CrtSetReportMode(_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
    _CrtSetReportFile(_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#   endif
# endif

  return RUN_ALL_TESTS();
}